

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<unsigned_int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,uint *v,uint v_min,uint v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  int iVar2;
  undefined1 auVar3 [12];
  ImGuiContext *pIVar4;
  uint uVar5;
  int iVar6;
  ImGuiContext *g;
  float *pfVar7;
  uint uVar8;
  bool is_logarithmic;
  bool bVar9;
  ulong idx;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float logarithmic_zero_epsilon;
  float fVar15;
  float t;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  float zero_deadzone_halfsize;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float old_clicked_t;
  undefined1 extraout_var [56];
  
  pIVar4 = GImGui;
  iVar2 = v_min - v_max;
  if (v_min < v_max) {
    iVar2 = -(v_min - v_max);
  }
  uVar5 = flags & 0x100000;
  idx = (ulong)(uVar5 >> 0x14);
  uVar8 = data_type & 0xfffffffe;
  is_logarithmic = (bool)((byte)((flags & 0x20U) >> 5) & uVar8 == 8);
  fVar10 = ImVec2::operator[](&bb->Max,idx);
  fVar11 = ImVec2::operator[](&bb->Min,idx);
  fVar11 = (fVar10 - fVar11) + -4.0;
  fVar10 = (pIVar4->Style).GrabMinSize;
  auVar18 = ZEXT416((uint)fVar10);
  if (-1 < iVar2 && uVar8 != 8) {
    auVar20 = ZEXT416((uint)(fVar11 / (float)(iVar2 + 1)));
    auVar18 = vcmpss_avx(ZEXT416((uint)fVar10),auVar20,2);
    auVar18 = vblendvps_avx(ZEXT416((uint)fVar10),auVar20,auVar18);
  }
  auVar18 = vminss_avx(auVar18,ZEXT416((uint)fVar11));
  fVar12 = auVar18._0_4_;
  fVar10 = fVar11 - fVar12;
  fVar13 = ImVec2::operator[](&bb->Min,idx);
  fVar14 = ImVec2::operator[](&bb->Max,idx);
  zero_deadzone_halfsize = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if (is_logarithmic != false) {
    iVar6 = ImParseFormatPrecision(format,3);
    logarithmic_zero_epsilon = powf(0.1,(float)iVar6);
    auVar18 = vmaxss_avx(ZEXT416((uint)fVar10),ZEXT416(0x3f800000));
    zero_deadzone_halfsize = ((pIVar4->Style).LogSliderDeadzone * 0.5) / auVar18._0_4_;
  }
  fVar13 = fVar13 + 2.0 + fVar12 * 0.5;
  if (pIVar4->ActiveId == id) {
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar4->ActiveIdIsJustActivated == true) {
        pIVar4->SliderCurrentAccum = 0.0;
        pIVar4->SliderCurrentAccumDirty = false;
      }
      auVar21._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      auVar21._8_56_ = extraout_var;
      auVar18 = auVar21._0_16_;
      if (uVar5 != 0) {
        auVar20 = vmovshdup_avx(auVar18);
        auVar18._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
        auVar18._8_4_ = auVar20._8_4_ ^ 0x80000000;
        auVar18._12_4_ = auVar20._12_4_ ^ 0x80000000;
      }
      fVar10 = auVar18._0_4_;
      if ((fVar10 != 0.0) || (NAN(fVar10))) {
        auVar3 = auVar18._4_12_;
        if ((uVar8 == 8) && (iVar6 = ImParseFormatPrecision(format,3), 0 < iVar6)) {
          auVar19._0_4_ = fVar10 / 100.0;
          auVar19._4_12_ = auVar3;
          auVar22._0_4_ = auVar19._0_4_ / 10.0;
          auVar22._4_12_ = auVar3;
          auVar18 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
          auVar20 = vblendvps_avx(auVar19,auVar22,auVar18);
        }
        else if ((iVar2 + 100U < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          auVar18 = vcmpss_avx(auVar18,ZEXT816(0) << 0x40,1);
          auVar23._8_4_ = 0xbf800000;
          auVar23._0_8_ = 0xbf800000bf800000;
          auVar23._12_4_ = 0xbf800000;
          auVar24._8_4_ = 0x3f800000;
          auVar24._0_8_ = 0x3f8000003f800000;
          auVar24._12_4_ = 0x3f800000;
          auVar18 = vblendvps_avx(auVar24,auVar23,auVar18);
          auVar20._0_4_ = auVar18._0_4_ / (float)iVar2;
          auVar20._4_12_ = auVar18._4_12_;
        }
        else {
          auVar20._0_4_ = fVar10 / 100.0;
          auVar20._4_12_ = auVar3;
        }
        auVar18 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
        auVar18 = vblendvps_avx(auVar20,ZEXT416((uint)(auVar20._0_4_ * 10.0)),auVar18);
        fVar10 = auVar18._0_4_ + pIVar4->SliderCurrentAccum;
        pIVar4->SliderCurrentAccum = fVar10;
        pIVar4->SliderCurrentAccumDirty = true;
      }
      else {
        fVar10 = pIVar4->SliderCurrentAccum;
      }
      if ((pIVar4->NavActivatePressedId == id) && (pIVar4->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar4->SliderCurrentAccumDirty == true) {
        fVar15 = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,*v,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                            zero_deadzone_halfsize);
        if (((1.0 <= fVar15) && (0.0 < fVar10)) || ((fVar15 <= 0.0 && (fVar10 < 0.0)))) {
          pIVar4->SliderCurrentAccum = 0.0;
          pIVar4->SliderCurrentAccumDirty = false;
          bVar9 = false;
          goto LAB_001724a8;
        }
        auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar10 + fVar15)));
        auVar18 = vcmpss_avx(ZEXT416((uint)(fVar10 + fVar15)),ZEXT816(0) << 0x40,1);
        auVar18 = vandnps_avx(auVar18,auVar20);
        t = auVar18._0_4_;
        uVar8 = ScaleValueFromRatioT<unsigned_int,int,float>
                          (data_type,t,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                           zero_deadzone_halfsize);
        if ((flags & 0x40U) == 0) {
          uVar8 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,uVar8);
        }
        fVar16 = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,uVar8,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                            zero_deadzone_halfsize);
        fVar16 = fVar16 - fVar15;
        bVar9 = fVar10 <= fVar16;
        if (0.0 < fVar10) {
          bVar9 = fVar16 < fVar10;
        }
        if (!bVar9) {
          fVar16 = fVar10;
        }
        pIVar4->SliderCurrentAccum = pIVar4->SliderCurrentAccum - fVar16;
        pIVar4->SliderCurrentAccumDirty = false;
        goto LAB_0017243e;
      }
      bVar9 = false;
      goto LAB_001724a8;
    }
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar4->IO).MouseDown[0] == false) {
        ClearActiveID();
        bVar9 = false;
        goto LAB_001724a8;
      }
      pfVar7 = ImVec2::operator[](&(pIVar4->IO).MousePos,idx);
      t = 0.0;
      if (0.0 < fVar10) {
        auVar17._0_4_ = (*pfVar7 - fVar13) / fVar10;
        auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar17);
        auVar18 = vcmpss_avx(auVar17,ZEXT816(0) << 0x40,1);
        auVar18 = vandnps_avx(auVar18,auVar20);
        t = auVar18._0_4_;
      }
      if (uVar5 != 0) {
        t = 1.0 - t;
      }
LAB_0017243e:
      uVar8 = ScaleValueFromRatioT<unsigned_int,int,float>
                        (data_type,t,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                         zero_deadzone_halfsize);
      if ((flags & 0x40U) == 0) {
        uVar8 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,uVar8);
      }
      if (*v == uVar8) {
        bVar9 = false;
      }
      else {
        *v = uVar8;
        bVar9 = true;
      }
      goto LAB_001724a8;
    }
  }
  bVar9 = false;
LAB_001724a8:
  if (1.0 <= fVar11) {
    fVar10 = ScaleRatioFromValueT<unsigned_int,int,float>
                       (data_type,*v,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                        zero_deadzone_halfsize);
    if (uVar5 != 0) {
      fVar10 = 1.0 - fVar10;
    }
    fVar13 = (((fVar14 + -2.0) - fVar12 * 0.5) - fVar13) * fVar10 + fVar13;
    if (uVar5 != 0) {
      fVar10 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar12 * 0.5 + fVar13;
      (out_grab_bb->Max).x = fVar10 + -2.0;
      (out_grab_bb->Max).y = fVar12 * 0.5 + fVar13;
    }
    else {
      fVar10 = (bb->Min).y;
      fVar11 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar12 * 0.5 + fVar13;
      (out_grab_bb->Min).y = fVar10 + 2.0;
      (out_grab_bb->Max).x = fVar12 * 0.5 + fVar13;
      (out_grab_bb->Max).y = fVar11 + -2.0;
    }
  }
  else {
    IVar1 = bb->Min;
    out_grab_bb->Min = IVar1;
    out_grab_bb->Max = IVar1;
  }
  return bVar9;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}